

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

char duckdb::Cast::Operation<duckdb::interval_t,signed_char>(interval_t input)

{
  interval_t input_00;
  bool bVar1;
  InvalidInputException *this;
  char *in_RSI;
  int64_t in_RDI;
  char result;
  undefined1 in_stack_00000190 [16];
  string *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  
  input_00.days._3_1_ = in_stack_ffffffffffffffef;
  input_00._0_7_ = in_stack_ffffffffffffffe8;
  input_00.micros = in_RDI;
  bVar1 = TryCast::Operation<duckdb::interval_t,signed_char>
                    (input_00,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::interval_t,signed_char>((interval_t)in_stack_00000190);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffff88);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return in_stack_ffffffffffffffef;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}